

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.c
# Opt level: O3

void TestSuite_Parser(void)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  char *__format;
  char *pcVar5;
  
  sysbvm_test_currentTestCaseName = "EmptyString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- EmptyString...");
  TuuvmCore_initialize();
  __format = "";
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:12: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 0) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:13: Obtained value is not equal to 0"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "SingleLineComment";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- SingleLineComment...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"## Comment","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:19: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 0) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:20: Obtained value is not equal to 0"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "MultiLineComment";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- MultiLineComment...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"#* \nMulti line comment \n *#","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:26: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 0) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:27: Obtained value is not equal to 0"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "IdentifierReference";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IdentifierReference...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"identifier","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:33: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:34: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar2 = sysbvm_astSequenceNode_getExpressionAt(sVar2,0);
  _Var1 = sysbvm_astNode_isIdentifierReferenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:37: Assertion failure: sysbvm_astNode_isIdentifierReferenceNode(sysbvm_test_context, node)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_symbol_internWithCString(sysbvm_test_context,"identifier");
  sVar2 = sysbvm_astIdentifierReferenceNode_getValue(sVar2);
  if (sVar4 != sVar2) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:38: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"identifier\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "LiteralInteger";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- LiteralInteger...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"1234","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:44: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:45: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar2 = sysbvm_astSequenceNode_getExpressionAt(sVar2,0);
  _Var1 = sysbvm_astNode_isLiteralNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:48: Assertion failure: sysbvm_astNode_isLiteralNode(sysbvm_test_context, node)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "LiteralSymbol";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- LiteralSymbol...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"#test","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:54: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:55: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar2 = sysbvm_astSequenceNode_getExpressionAt(sVar2,0);
  _Var1 = sysbvm_astNode_isLiteralNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:58: Assertion failure: sysbvm_astNode_isLiteralNode(sysbvm_test_context, node)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_symbol_internWithCString(sysbvm_test_context,"test");
  sVar2 = sysbvm_astLiteralNode_getValue(sVar2);
  if (sVar4 != sVar2) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:59: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"test\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "LexicalBlock";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- LexicalBlock...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"{}","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:65: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:66: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar2 = sysbvm_astSequenceNode_getExpressionAt(sVar2,0);
  _Var1 = sysbvm_astNode_isLexicalBlockNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:69: Assertion failure: sysbvm_astNode_isLexicalBlockNode(sysbvm_test_context, node)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "MessageWithoutReceiver";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- MessageWithoutReceiver...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"let: #x with: 42","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:75: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:76: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar2 = sysbvm_astSequenceNode_getExpressionAt(sVar2,0);
  _Var1 = sysbvm_astNode_isUnexpandedApplicationNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:79: Assertion failure: sysbvm_astNode_isUnexpandedApplicationNode(sysbvm_test_context, node)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar5 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar5 = " Success\n";
  }
  printf(pcVar5);
  sysbvm_test_currentTestCaseName = "KeywordMessage";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- KeywordMessage...");
  TuuvmCore_initialize();
  sVar2 = sysbvm_parser_parseCString(sysbvm_test_context,"a perform: #yourself","test");
  _Var1 = sysbvm_astNode_isSequenceNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:85: Assertion failure: sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar3 = sysbvm_astSequenceNode_getExpressionCount(sVar2);
  if (sVar3 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:86: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar2 = sysbvm_astSequenceNode_getExpressionAt(sVar2,0);
  _Var1 = sysbvm_astNode_isMessageSendNode(sysbvm_test_context,sVar2);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Parser.c:89: Assertion failure: sysbvm_astNode_isMessageSendNode(sysbvm_test_context, node)"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  if (sysbvm_test_currentHasError == 0) {
    __format = " Success\n";
  }
  printf(__format);
  return;
}

Assistant:

TEST_SUITE(Parser)
{
    TEST_CASE_WITH_FIXTURE(EmptyString, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(0, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));
    }

    TEST_CASE_WITH_FIXTURE(SingleLineComment, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "## Comment", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(0, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));
    }

    TEST_CASE_WITH_FIXTURE(MultiLineComment, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "#* \nMulti line comment \n *#", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(0, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));
    }

    TEST_CASE_WITH_FIXTURE(IdentifierReference, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "identifier", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(1, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));

        sysbvm_tuple_t node = sysbvm_astSequenceNode_getExpressionAt(sequenceNode, 0);
        TEST_ASSERT(sysbvm_astNode_isIdentifierReferenceNode(sysbvm_test_context, node));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "identifier"), sysbvm_astIdentifierReferenceNode_getValue(node));
    }

    TEST_CASE_WITH_FIXTURE(LiteralInteger, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "1234", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(1, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));

        sysbvm_tuple_t node = sysbvm_astSequenceNode_getExpressionAt(sequenceNode, 0);
        TEST_ASSERT(sysbvm_astNode_isLiteralNode(sysbvm_test_context, node));
    }

    TEST_CASE_WITH_FIXTURE(LiteralSymbol, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "#test", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(1, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));

        sysbvm_tuple_t node = sysbvm_astSequenceNode_getExpressionAt(sequenceNode, 0);
        TEST_ASSERT(sysbvm_astNode_isLiteralNode(sysbvm_test_context, node));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "test"), sysbvm_astLiteralNode_getValue(node));
    }

    TEST_CASE_WITH_FIXTURE(LexicalBlock, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "{}", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(1, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));

        sysbvm_tuple_t node = sysbvm_astSequenceNode_getExpressionAt(sequenceNode, 0);
        TEST_ASSERT(sysbvm_astNode_isLexicalBlockNode(sysbvm_test_context, node));
    }

    TEST_CASE_WITH_FIXTURE(MessageWithoutReceiver, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "let: #x with: 42", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(1, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));

        sysbvm_tuple_t node = sysbvm_astSequenceNode_getExpressionAt(sequenceNode, 0);
        TEST_ASSERT(sysbvm_astNode_isUnexpandedApplicationNode(sysbvm_test_context, node));
    }

    TEST_CASE_WITH_FIXTURE(KeywordMessage, TuuvmCore)
    {
        sysbvm_tuple_t sequenceNode = sysbvm_parser_parseCString(sysbvm_test_context, "a perform: #yourself", "test");
        TEST_ASSERT(sysbvm_astNode_isSequenceNode(sysbvm_test_context, sequenceNode));
        TEST_ASSERT_EQUALS(1, sysbvm_astSequenceNode_getExpressionCount(sequenceNode));

        sysbvm_tuple_t node = sysbvm_astSequenceNode_getExpressionAt(sequenceNode, 0);
        TEST_ASSERT(sysbvm_astNode_isMessageSendNode(sysbvm_test_context, node));
    }

}